

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_PoolAllocator.h
# Opt level: O1

NamespaceAliasDeclaration * __thiscall
soul::PoolAllocator::
allocate<soul::AST::NamespaceAliasDeclaration,soul::AST::Context&,soul::Identifier,soul::AST::QualifiedIdentifier&,soul::AST::CommaSeparatedList&>
          (PoolAllocator *this,Context *args,Identifier *args_1,QualifiedIdentifier *args_2,
          CommaSeparatedList *args_3)

{
  string *psVar1;
  SourceCodeText *pSVar2;
  PoolItem *pPVar3;
  
  pPVar3 = allocateSpaceForObject(this,0x48);
  psVar1 = args_1->name;
  pPVar3->item = &PTR__ASTObject_00301658;
  *(undefined4 *)&pPVar3->field_0x18 = 5;
  pSVar2 = (args->location).sourceCode.object;
  pPVar3[1].size = (size_t)pSVar2;
  if (pSVar2 != (SourceCodeText *)0x0) {
    (pSVar2->super_RefCountedObject).refCount = (pSVar2->super_RefCountedObject).refCount + 1;
  }
  pPVar3[1].destructor = (DestructorFn *)(args->location).location.data;
  pPVar3[1].item = args->parentScope;
  pPVar3->item = &PTR__NamespaceAliasDeclaration_00302750;
  *(string **)&pPVar3[1].field_0x18 = psVar1;
  pPVar3[2].size = (size_t)args_2;
  pPVar3[2].destructor = (DestructorFn *)args_3;
  pPVar3[2].item = (void *)0x0;
  pPVar3->destructor =
       allocate<soul::AST::NamespaceAliasDeclaration,_soul::AST::Context_&,_soul::Identifier,_soul::AST::QualifiedIdentifier_&,_soul::AST::CommaSeparatedList_&>
       ::anon_class_1_0_00000001::__invoke;
  return (NamespaceAliasDeclaration *)&pPVar3->item;
}

Assistant:

Type& allocate (Args&&... args)
    {
        static_assert (sizeof (Type) + itemHeaderSize <= sizeof (Pool::space), "Can't allocate a pool object bigger than the pool block size");
        auto& newItem = allocateSpaceForObject (sizeof (Type));
        auto newObject = new (std::addressof (newItem.item)) Type (std::forward<Args> (args)...);

        // NB: the constructor may throw, so we have to be careful not to register its destructor until afterwards
        if constexpr (! std::is_trivially_destructible<Type>::value)
            newItem.destructor = [] (void* t) { static_cast<Type*> (t)->~Type(); };

        return *newObject;
    }